

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O3

idx_t __thiscall
duckdb::RowGroup::GetSelVector
          (RowGroup *this,TransactionData transaction,idx_t vector_idx,SelectionVector *sel_vector,
          idx_t max_count)

{
  optional_ptr<duckdb::RowVersionManager,_true> local_30;
  
  local_30 = GetVersionInfo(this);
  if (local_30.ptr != (RowVersionManager *)0x0) {
    optional_ptr<duckdb::RowVersionManager,_true>::CheckValid(&local_30);
    max_count = RowVersionManager::GetSelVector
                          (local_30.ptr,transaction,vector_idx,sel_vector,max_count);
  }
  return max_count;
}

Assistant:

idx_t RowGroup::GetSelVector(TransactionData transaction, idx_t vector_idx, SelectionVector &sel_vector,
                             idx_t max_count) {
	auto vinfo = GetVersionInfo();
	if (!vinfo) {
		return max_count;
	}
	return vinfo->GetSelVector(transaction, vector_idx, sel_vector, max_count);
}